

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O0

int corpus_set_ctl_filename(char *ctl_filename)

{
  lineiter_t *li_00;
  lineiter_t *li;
  char *ctl_filename_local;
  
  ctl_fp = (FILE *)fopen(ctl_filename,"rb");
  if ((FILE *)ctl_fp == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                   ,0x13c,"Unable to open %s for reading",ctl_filename);
    ctl_filename_local._4_4_ = -1;
  }
  else {
    li_00 = lineiter_start_clean(ctl_fp);
    if (li_00 == (lineiter_t *)0x0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
              ,0x143,"Must be at least one line in the control file\n");
      ctl_filename_local._4_4_ = -1;
    }
    else {
      parse_ctl_line(li_00->buf,&next_ctl_path,&next_ctl_sf,&next_ctl_ef,&next_ctl_utt_id);
      lineiter_free(li_00);
      ctl_filename_local._4_4_ = 0;
    }
  }
  return ctl_filename_local._4_4_;
}

Assistant:

int
corpus_set_ctl_filename(const char *ctl_filename)
{
    lineiter_t *li;
    ctl_fp = fopen(ctl_filename, "rb");

    if (ctl_fp == NULL) {
	E_ERROR_SYSTEM("Unable to open %s for reading",  ctl_filename);
	return S3_ERROR;
    }
    
    li = lineiter_start_clean(ctl_fp);

    if (li == NULL) {
	E_ERROR("Must be at least one line in the control file\n");
	return S3_ERROR;
    }

    parse_ctl_line(li->buf,
		   &next_ctl_path,
		   &next_ctl_sf,
		   &next_ctl_ef,
		   &next_ctl_utt_id);
    lineiter_free (li);
    
    return S3_SUCCESS;
}